

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

Vec_Int_t * Vec_IntTwoMerge(Vec_Int_t *vArr1,Vec_Int_t *vArr2)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  
  pVVar5 = Vec_IntAlloc(vArr2->nSize + vArr1->nSize);
  piVar4 = pVVar5->pArray;
  piVar9 = vArr1->pArray;
  piVar8 = vArr2->pArray;
  piVar1 = piVar9 + vArr1->nSize;
  piVar2 = piVar8 + vArr2->nSize;
  uVar7 = 0;
  while ((piVar9 < piVar1 && (piVar8 < piVar2))) {
    iVar6 = *piVar9;
    iVar3 = *piVar8;
    if (iVar6 == iVar3) {
      piVar9 = piVar9 + 1;
      *(int *)((long)piVar4 + uVar7) = iVar6;
      piVar8 = piVar8 + 1;
    }
    else if (iVar6 < iVar3) {
      piVar9 = piVar9 + 1;
      *(int *)((long)piVar4 + uVar7) = iVar6;
    }
    else {
      piVar8 = piVar8 + 1;
      *(int *)((long)piVar4 + uVar7) = iVar3;
    }
    uVar7 = uVar7 + 4;
  }
  for (; piVar9 < piVar1; piVar9 = piVar9 + 1) {
    *(int *)((long)piVar4 + uVar7) = *piVar9;
    uVar7 = uVar7 + 4;
  }
  for (; piVar8 < piVar2; piVar8 = piVar8 + 1) {
    *(int *)((long)piVar4 + uVar7) = *piVar8;
    uVar7 = uVar7 + 4;
  }
  iVar6 = (int)(uVar7 >> 2);
  pVVar5->nSize = iVar6;
  if (pVVar5->nCap < iVar6) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x722,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar6 < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x723,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar6 < vArr2->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x724,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  return pVVar5;
}

Assistant:

static inline Vec_Int_t * Vec_IntTwoMerge( Vec_Int_t * vArr1, Vec_Int_t * vArr2 )
{
    Vec_Int_t * vArr = Vec_IntAlloc( vArr1->nSize + vArr2->nSize ); 
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
    return vArr;
}